

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O0

visplane_t *
swrenderer::R_FindPlane
          (secplane_t *height,FTextureID picnum,int lightlevel,double Alpha,bool additive,
          FTransform *xxform,int sky,FSectorPortal *portal)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  fixed_t fVar4;
  TAngle<double> *other;
  visplane_t *pvVar5;
  double dVar6;
  uint local_d8;
  TAngle<double> local_d0;
  undefined1 local_c8 [8];
  FTransform nulltransform;
  FTransform *pFStack_88;
  fixed_t alpha;
  FTransform *xform;
  bool isskybox;
  visplane_t *pvStack_78;
  uint hash;
  visplane_t *check;
  secplane_t plane;
  int sky_local;
  FTransform *xxform_local;
  bool additive_local;
  double Alpha_local;
  int lightlevel_local;
  secplane_t *height_local;
  FTextureID picnum_local;
  
  plane.negiC._4_4_ = sky;
  height_local._4_4_ = picnum.texnum;
  secplane_t::secplane_t((secplane_t *)&check);
  nulltransform.baseAngle.Degrees._4_4_ = FloatToFixed(Alpha);
  FTransform::FTransform((FTransform *)local_c8);
  bVar1 = FTextureID::operator==((FTextureID *)((long)&height_local + 4),&skyflatnum);
  if (bVar1) {
    Alpha_local._4_4_ = 0;
    pFStack_88 = (FTransform *)local_c8;
    nulltransform.yOffs = 0.0;
    nulltransform.xOffs = 0.0;
    local_c8 = (undefined1  [8])0x0;
    nulltransform.xScale = 1.0;
    nulltransform.baseyOffs = 1.0;
    other = TAngle<double>::operator=(&nulltransform.Angle,0.0);
    TAngle<double>::operator=((TAngle<double> *)&nulltransform.yScale,other);
    xxform_local._7_1_ = 0;
    dVar6 = secplane_t::fC(height);
    secplane_t::set((secplane_t *)&check,0.0,0.0,dVar6,0.0);
    bVar1 = false;
    if (portal != (FSectorPortal *)0x0) {
      bVar1 = (portal->mFlags & 2U) == 0;
    }
  }
  else {
    pFStack_88 = xxform;
    xxform_local._7_1_ = additive;
    Alpha_local._4_4_ = lightlevel;
    if ((portal == (FSectorPortal *)0x0) || ((portal->mFlags & 2U) != 0)) {
      secplane_t::operator=((secplane_t *)&check,height);
      bVar1 = false;
      if ((fake3D & 3) == 0) {
        plane.negiC._4_4_ = 0;
      }
      else {
        plane.negiC._4_4_ = fakeAlpha | 0x80000000;
      }
      portal = (FSectorPortal *)0x0;
      nulltransform.baseAngle.Degrees._4_4_ = 0x10000;
    }
    else {
      secplane_t::operator=((secplane_t *)&check,height);
      bVar1 = true;
    }
  }
  if (bVar1) {
    local_d8 = 0x80;
  }
  else {
    iVar3 = FTextureID::GetIndex((FTextureID *)((long)&height_local + 4));
    dVar6 = secplane_t::fD(height);
    fVar4 = FloatToFixed(dVar6);
    local_d8 = iVar3 * 3 + Alpha_local._4_4_ + fVar4 * 7 & 0x7f;
  }
  pvStack_78 = *(visplane_t **)(visplanes + (ulong)local_d8 * 8);
  do {
    if (pvStack_78 == (visplane_t *)0x0) {
      pvVar5 = new_visplane(local_d8);
      secplane_t::operator=(&pvVar5->height,(secplane_t *)&check);
      (pvVar5->picnum).texnum = height_local._4_4_;
      pvVar5->lightlevel = Alpha_local._4_4_;
      FTransform::operator=(&pvVar5->xform,pFStack_88);
      pvVar5->colormap = basecolormap;
      pvVar5->sky = plane.negiC._4_4_;
      pvVar5->portal = portal;
      pvVar5->left = viewwidth;
      pvVar5->right = 0;
      pvVar5->extralight = stacked_extralight;
      pvVar5->visibility = stacked_visibility;
      TVector3<double>::operator=(&pvVar5->viewpos,(TVector3<double> *)stacked_viewpos);
      TAngle<double>::operator=(&pvVar5->viewangle,(TAngle<double> *)&stacked_angle);
      pvVar5->Alpha = nulltransform.baseAngle.Degrees._4_4_;
      pvVar5->Additive = (bool)(xxform_local._7_1_ & 1);
      pvVar5->CurrentPortalUniq = CurrentPortalUniq;
      pvVar5->MirrorFlags = (uint)MirrorFlags;
      pvVar5->CurrentSkybox = CurrentSkybox;
      fillshort(&pvVar5->field_0xda,viewwidth,0x7fff);
      return pvVar5;
    }
    if (bVar1) {
      if ((portal == pvStack_78->portal) &&
         (bVar2 = secplane_t::operator==((secplane_t *)&check,&pvStack_78->height), bVar2)) {
        if (portal->mType == 0) {
          return pvStack_78;
        }
        if (pvStack_78->extralight == stacked_extralight) {
          if (((pvStack_78->visibility == stacked_visibility) &&
              (!NAN(pvStack_78->visibility) && !NAN(stacked_visibility))) &&
             (bVar2 = TVector3<double>::operator==
                                (&pvStack_78->viewpos,(TVector3<double> *)stacked_viewpos), bVar2))
          {
            if (portal->mType != 1) {
              return pvStack_78;
            }
            if (((pvStack_78->Alpha == nulltransform.baseAngle.Degrees._4_4_) &&
                ((pvStack_78->Additive & 1U) == (xxform_local._7_1_ & 1))) &&
               ((nulltransform.baseAngle.Degrees._4_4_ == 0 ||
                (((bVar2 = secplane_t::operator==((secplane_t *)&check,&pvStack_78->height), bVar2
                  && (bVar2 = FTextureID::operator==
                                        ((FTextureID *)((long)&height_local + 4),&pvStack_78->picnum
                                        ), bVar2)) &&
                 ((Alpha_local._4_4_ == pvStack_78->lightlevel &&
                  ((basecolormap == pvStack_78->colormap &&
                   (bVar2 = FTransform::operator==(pFStack_88,&pvStack_78->xform), bVar2)))))))))) {
              TAngle<double>::TAngle(&local_d0,(TAngle<double> *)&stacked_angle);
              bVar2 = TAngle<double>::operator==(&pvStack_78->viewangle,&local_d0);
              if (bVar2) {
                return pvStack_78;
              }
            }
          }
        }
      }
    }
    else {
      bVar2 = secplane_t::operator==((secplane_t *)&check,&pvStack_78->height);
      if (((((((bVar2) &&
              (bVar2 = FTextureID::operator==
                                 ((FTextureID *)((long)&height_local + 4),&pvStack_78->picnum),
              bVar2)) && (Alpha_local._4_4_ == pvStack_78->lightlevel)) &&
            ((basecolormap == pvStack_78->colormap &&
             (bVar2 = FTransform::operator==(pFStack_88,&pvStack_78->xform), bVar2)))) &&
           ((plane.negiC._4_4_ == pvStack_78->sky &&
            ((CurrentPortalUniq == pvStack_78->CurrentPortalUniq &&
             ((uint)MirrorFlags == pvStack_78->MirrorFlags)))))) &&
          (CurrentSkybox == pvStack_78->CurrentSkybox)) &&
         (bVar2 = TVector3<double>::operator==(&ViewPos,&pvStack_78->viewpos), bVar2)) {
        return pvStack_78;
      }
    }
    pvStack_78 = pvStack_78->next;
  } while( true );
}

Assistant:

visplane_t *R_FindPlane (const secplane_t &height, FTextureID picnum, int lightlevel, double Alpha, bool additive,
						const FTransform &xxform,
						 int sky, FSectorPortal *portal)
{
	secplane_t plane;
	visplane_t *check;
	unsigned hash;						// killough
	bool isskybox;
	const FTransform *xform = &xxform;
	fixed_t alpha = FLOAT2FIXED(Alpha);
	//angle_t angle = (xform.Angle + xform.baseAngle).BAMs();

	FTransform nulltransform;

	if (picnum == skyflatnum)	// killough 10/98
	{ // most skies map together
		lightlevel = 0;
		xform = &nulltransform;
		nulltransform.xOffs = nulltransform.yOffs = nulltransform.baseyOffs = 0;
		nulltransform.xScale = nulltransform.yScale = 1;
		nulltransform.Angle = nulltransform.baseAngle = 0.0;
		additive = false;
		// [RH] Map floor skies and ceiling skies to separate visplanes. This isn't
		// always necessary, but it is needed if a floor and ceiling sky are in the
		// same column but separated by a wall. If they both try to reside in the
		// same visplane, then only the floor sky will be drawn.
		plane.set(0., 0., height.fC(), 0.);
		isskybox = portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX);
	}
	else if (portal != NULL && !(portal->mFlags & PORTSF_INSKYBOX))
	{
		plane = height;
		isskybox = true;
	}
	else
	{
		plane = height;
		isskybox = false;
		// kg3D - hack, store alpha in sky
		// i know there is ->alpha, but this also allows to identify fake plane
		// and ->alpha is for stacked sectors
		if (fake3D & (FAKE3D_FAKEFLOOR|FAKE3D_FAKECEILING)) sky = 0x80000000 | fakeAlpha;
		else sky = 0;	// not skyflatnum so it can't be a sky
		portal = NULL;
		alpha = OPAQUE;
	}

	// New visplane algorithm uses hash table -- killough
	hash = isskybox ? MAXVISPLANES : visplane_hash (picnum.GetIndex(), lightlevel, height);

	for (check = visplanes[hash]; check; check = check->next)	// killough
	{
		if (isskybox)
		{
			if (portal == check->portal && plane == check->height)
			{
				if (portal->mType != PORTS_SKYVIEWPOINT)
				{ // This skybox is really a stacked sector, so we need to
				  // check even more.
					if (check->extralight == stacked_extralight &&
						check->visibility == stacked_visibility &&
						check->viewpos == stacked_viewpos &&
						(
							// headache inducing logic... :(
							(portal->mType != PORTS_STACKEDSECTORTHING) ||
							(
								check->Alpha == alpha &&
								check->Additive == additive &&
								(alpha == 0 ||	// if alpha is > 0 everything needs to be checked
									(plane == check->height &&
									 picnum == check->picnum &&
									 lightlevel == check->lightlevel &&
									 basecolormap == check->colormap &&	// [RH] Add more checks
									 *xform == check->xform
									)
								) &&
								check->viewangle == stacked_angle
							)
						)
					   )
					{
						return check;
					}
				}
				else
				{
					return check;
				}
			}
		}
		else
		if (plane == check->height &&
			picnum == check->picnum &&
			lightlevel == check->lightlevel &&
			basecolormap == check->colormap &&	// [RH] Add more checks
			*xform == check->xform &&
			sky == check->sky &&
			CurrentPortalUniq == check->CurrentPortalUniq &&
			MirrorFlags == check->MirrorFlags &&
			CurrentSkybox == check->CurrentSkybox &&
			ViewPos == check->viewpos
			)
		{
		  return check;
		}
	}

	check = new_visplane (hash);		// killough

	check->height = plane;
	check->picnum = picnum;
	check->lightlevel = lightlevel;
	check->xform = *xform;
	check->colormap = basecolormap;		// [RH] Save colormap
	check->sky = sky;
	check->portal = portal;
	check->left = viewwidth;			// Was SCREENWIDTH -- killough 11/98
	check->right = 0;
	check->extralight = stacked_extralight;
	check->visibility = stacked_visibility;
	check->viewpos = stacked_viewpos;
	check->viewangle = stacked_angle;
	check->Alpha = alpha;
	check->Additive = additive;
	check->CurrentPortalUniq = CurrentPortalUniq;
	check->MirrorFlags = MirrorFlags;
	check->CurrentSkybox = CurrentSkybox;

	fillshort (check->top, viewwidth, 0x7fff);

	return check;
}